

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_negotiate_alps(SSL_HANDSHAKE *hs,uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello)

{
  undefined1 *puVar1;
  SSL *ssl;
  bool bVar2;
  undefined8 __src;
  undefined8 __n;
  bool bVar3;
  bool bVar4;
  uint8_t uVar5;
  uint16_t uVar6;
  int iVar7;
  size_t in_R8;
  ptrdiff_t _Num;
  uint16_t extension_type;
  Array<unsigned_char> *this;
  Span<const_unsigned_char> protocol;
  Span<const_unsigned_char> settings;
  CBS alps_list;
  CBS protocol_name;
  CBS alps_contents;
  undefined1 local_78 [32];
  long local_58;
  CBS local_50;
  CBS local_40;
  
  ssl = hs->ssl;
  if ((ssl->s3->alpn_selected).size_ == 0) {
    bVar4 = true;
  }
  else {
    local_78._0_8_ = (SSL *)0x0;
    local_78._8_8_ = (SSL_CONFIG *)0x0;
    extension_type = 0x44cd;
    if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
      extension_type = 0x4469;
    }
    uVar6 = ssl_protocol_version(ssl);
    bVar4 = true;
    if (((0x303 < uVar6) &&
        (protocol.size_ = in_R8, protocol.data_ = (uchar *)(ssl->s3->alpn_selected).size_,
        bVar3 = ssl_get_local_application_settings
                          ((bssl *)hs,(SSL_HANDSHAKE *)local_78,
                           (Span<const_unsigned_char> *)(ssl->s3->alpn_selected).data_,protocol),
        bVar3)) &&
       (bVar3 = ssl_client_hello_get_extension(client_hello,&local_40,extension_type), bVar3)) {
      iVar7 = CBS_get_u16_length_prefixed(&local_40,(CBS *)(local_78 + 0x18));
      if (((iVar7 == 0) || (local_40.len != 0)) || (local_58 == 0)) {
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xd85);
        uVar5 = '2';
LAB_00136a79:
        *out_alert = uVar5;
      }
      else {
        bVar3 = false;
        bVar4 = false;
        do {
          __n = local_78._8_8_;
          __src = local_78._0_8_;
          if (local_58 == 0) {
            if (!bVar4) {
              return true;
            }
            puVar1 = &((hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8;
            *puVar1 = *puVar1 | 0x40;
            this = &((hs->new_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                    local_application_settings;
            bVar4 = Array<unsigned_char>::InitUninitialized(this,local_78._8_8_);
            if ((SSL_CONFIG *)__n != (SSL_CONFIG *)0x0 && bVar4) {
              memmove(this->data_,(void *)__src,__n);
            }
            uVar5 = 'P';
            if (bVar4) {
              return true;
            }
            goto LAB_00136a79;
          }
          iVar7 = CBS_get_u8_length_prefixed((CBS *)(local_78 + 0x18),&local_50);
          if ((iVar7 == 0) || (local_50.len == 0)) {
            bVar2 = false;
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0xd8e);
            *out_alert = '2';
          }
          else {
            bVar2 = true;
            if ((local_50.len == (ssl->s3->alpn_selected).size_) &&
               (iVar7 = bcmp(local_50.data,(ssl->s3->alpn_selected).data_,local_50.len),
               bVar4 = bVar3, iVar7 == 0)) {
              bVar4 = true;
              bVar3 = bVar4;
            }
          }
        } while (bVar2);
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool ssl_negotiate_alps(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                        const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->alpn_selected.empty()) {
    return true;
  }

  // If we negotiate ALPN over TLS 1.3, try to negotiate ALPS.
  CBS alps_contents;
  Span<const uint8_t> settings;
  uint16_t extension_type = TLSEXT_TYPE_application_settings_old;
  if (hs->config->alps_use_new_codepoint) {
    extension_type = TLSEXT_TYPE_application_settings;
  }
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
      ssl_get_local_application_settings(hs, &settings,
                                         ssl->s3->alpn_selected) &&
      ssl_client_hello_get_extension(client_hello, &alps_contents,
                                     extension_type)) {
    // Check if the client supports ALPS with the selected ALPN.
    bool found = false;
    CBS alps_list;
    if (!CBS_get_u16_length_prefixed(&alps_contents, &alps_list) ||  //
        CBS_len(&alps_contents) != 0 ||                              //
        CBS_len(&alps_list) == 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }
    while (CBS_len(&alps_list) > 0) {
      CBS protocol_name;
      if (!CBS_get_u8_length_prefixed(&alps_list, &protocol_name) ||
          // Empty protocol names are forbidden.
          CBS_len(&protocol_name) == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }
      if (protocol_name == Span(ssl->s3->alpn_selected)) {
        found = true;
      }
    }

    // Negotiate ALPS if both client also supports ALPS for this protocol.
    if (found) {
      hs->new_session->has_application_settings = true;
      if (!hs->new_session->local_application_settings.CopyFrom(settings)) {
        *out_alert = SSL_AD_INTERNAL_ERROR;
        return false;
      }
    }
  }

  return true;
}